

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterFwd.hpp
# Opt level: O0

void __thiscall CLI::FormatterBase::FormatterBase(FormatterBase *this)

{
  FormatterBase *this_local;
  
  this->_vptr_FormatterBase = (_func_int **)&PTR__FormatterBase_0017b6c8;
  this->column_width_ = 0x1e;
  this->right_column_width_ = 0x41;
  this->description_paragraph_width_ = 0x50;
  this->footer_paragraph_width_ = 0x50;
  memset(&this->labels_,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->labels_);
  return;
}

Assistant:

FormatterBase() = default;